

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void LowerBinaryMemoryOperationIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,VmInstruction *inst,RegVmInstructionCode iCode,RegVmInstructionCode fCode,
               RegVmInstructionCode dCode,RegVmInstructionCode lCode)

{
  uint uVar1;
  VmValueType VVar2;
  VmValue **ppVVar3;
  VmValue *pVVar4;
  uchar uVar5;
  VmConstant *pVVar6;
  SynBase *location;
  VmValue *pVVar7;
  uchar addressReg;
  uchar local_3d;
  RegVmInstructionCode local_3c;
  VmConstant *local_38;
  
  local_3c = fCode;
  if ((inst->arguments).count == 0) {
LAB_00271a97:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
  uVar5 = GetArgumentRegister(ctx,lowFunction,lowBlock,*(inst->arguments).data);
  addressReg = '\0';
  uVar1 = (inst->arguments).count;
  if (((uVar1 < 2) || (uVar1 == 2)) ||
     (ppVVar3 = (inst->arguments).data, local_3d = uVar5,
     pVVar6 = GetLoadRegisterAndOffset(ctx,lowFunction,lowBlock,ppVVar3[1],ppVVar3[2],&addressReg),
     (inst->arguments).count < 4)) goto LAB_00271a97;
  pVVar7 = (inst->arguments).data[3];
  if ((pVVar7 == (VmValue *)0x0) || (pVVar7->typeID != 1)) {
    pVVar7 = (VmValue *)0x0;
  }
  local_38 = pVVar6;
  uVar5 = RegVmLoweredFunction::AllocateRegister(lowFunction,&inst->super_VmValue,0,true);
  if ((inst->arguments).count == 0) goto LAB_00271a97;
  pVVar4 = *(inst->arguments).data;
  VVar2 = (pVVar4->type).type;
  uVar1 = (pVVar4->type).size;
  if ((VVar2 == VM_TYPE_INT) && (uVar1 == 4)) {
    location = (inst->super_VmValue).source;
    goto LAB_00271a7d;
  }
  if (uVar1 != 8 || VVar2 != VM_TYPE_DOUBLE) {
LAB_00271a42:
    iCode = lCode;
    if ((VVar2 != VM_TYPE_POINTER) && (uVar1 != 8 || VVar2 != VM_TYPE_LONG)) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x2c0,
                    "void LowerBinaryMemoryOperationIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmInstruction *, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode)"
                   );
    }
  }
  else {
    if ((local_3c != rviNop) && (*(int *)&pVVar7[1]._vptr_VmValue == 3)) {
      location = (inst->super_VmValue).source;
      iCode = local_3c;
      goto LAB_00271a7d;
    }
    if (((uVar1 != 8 || VVar2 != VM_TYPE_DOUBLE) || (dCode == rviNop)) ||
       (iCode = dCode, *(int *)&pVVar7[1]._vptr_VmValue != 4)) goto LAB_00271a42;
  }
  location = (inst->super_VmValue).source;
LAB_00271a7d:
  RegVmLoweredBlock::AddInstruction(lowBlock,ctx,location,iCode,uVar5,local_3d,addressReg,local_38);
  return;
}

Assistant:

void LowerBinaryMemoryOperationIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmInstruction *inst, RegVmInstructionCode iCode, RegVmInstructionCode fCode, RegVmInstructionCode dCode, RegVmInstructionCode lCode)
{
	unsigned char lhsReg = GetArgumentRegister(ctx, lowFunction, lowBlock, inst->arguments[0]);
	unsigned char addressReg = 0;
	VmConstant *constant = GetLoadRegisterAndOffset(ctx, lowFunction, lowBlock, inst->arguments[1], inst->arguments[2], addressReg);
	VmConstant *loadType = getType<VmConstant>(inst->arguments[3]);
	unsigned char targetReg = lowFunction->AllocateRegister(inst);

	VmType type = inst->arguments[0]->type;

	if(type == VmType::Int || (type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
		lowBlock->AddInstruction(ctx, inst->source, iCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Double && loadType->iValue == VM_INST_LOAD_FLOAT && fCode != rviNop)
		lowBlock->AddInstruction(ctx, inst->source, fCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Double && loadType->iValue == VM_INST_LOAD_DOUBLE && dCode != rviNop)
		lowBlock->AddInstruction(ctx, inst->source, dCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Long || (type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
		lowBlock->AddInstruction(ctx, inst->source, lCode, targetReg, lhsReg, addressReg, constant);
	else
		assert(!"unknown type");
}